

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

int helicsGetOptionIndex(char *val)

{
  int iVar1;
  allocator<char> local_29;
  string local_28;
  
  if (val == (char *)0x0) {
    iVar1 = -1;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,val,&local_29);
    iVar1 = helics::getOptionIndex(&local_28);
    std::__cxx11::string::~string((string *)&local_28);
  }
  return iVar1;
}

Assistant:

int helicsGetOptionIndex(const char* val)
{
    if (val == nullptr) {
        return -1;
    }
    return helics::getOptionIndex(val);
}